

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sunlinsol_spfgmr.c
# Opt level: O0

SUNErrCode SUNLinSol_SPFGMRSetPrecType(SUNLinearSolver S,int pretype)

{
  undefined4 uVar1;
  bool bVar2;
  int pretype_local;
  SUNLinearSolver S_local;
  
  bVar2 = true;
  if ((pretype != 1) && (bVar2 = true, pretype != 2)) {
    bVar2 = pretype == 3;
  }
  uVar1 = 0;
  if (bVar2) {
    uVar1 = 2;
  }
  *(undefined4 *)((long)S->content + 4) = uVar1;
  return 0;
}

Assistant:

SUNErrCode SUNLinSol_SPFGMRSetPrecType(SUNLinearSolver S, int pretype)
{
  /* Check for legal pretype */
  pretype = ((pretype == SUN_PREC_LEFT) || (pretype == SUN_PREC_RIGHT) ||
             (pretype == SUN_PREC_BOTH))
              ? SUN_PREC_RIGHT
              : SUN_PREC_NONE;

  /* Set pretype */
  SPFGMR_CONTENT(S)->pretype = pretype;
  return SUN_SUCCESS;
}